

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::printFunction(VirtualMachine *this,Function *fn)

{
  pointer pBVar1;
  ostream *poVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  ByteCode bc;
  string local_58;
  char local_31;
  
  poVar2 = this->out;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"| | Argument Count: ",0x14);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_58._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_58,1);
  poVar2 = this->out;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"| | Local Count: ",0x11);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_58._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"| | Capture Contexts:\n",0x16);
  if ((fn->closures).
      super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (fn->closures).
      super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      poVar2 = this->out;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"| |   |",7);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"| ClosureContext(scopeOffsets:",0x1e);
      if ((ulong)((long)(fn->closures).
                        super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(fn->closures).
                        super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar5) goto LAB_00119bc1;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", LocalIndex: ",0xe);
      if ((ulong)((long)(fn->closures).
                        super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(fn->closures).
                        super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar5) goto LAB_00119bc1;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      local_58._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_58,1);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(fn->closures).
                                   super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(fn->closures).
                                   super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"| | Byte Code:\n",0xf);
  if ((fn->byteCode).super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (fn->byteCode).super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      poVar2 = this->out;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"| |   |",7);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"| ",2);
      pBVar1 = (fn->byteCode).
               super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(fn->byteCode).
                        super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 4) <= uVar5) {
LAB_00119bc1:
        uVar3 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
            &local_58.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                          local_58.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar3);
      }
      bc._4_4_ = 0;
      bc.instruction = *(uint *)((long)pBVar1 + lVar4 + -8);
      bc.parameter = *(size_t *)((long)&pBVar1->instruction + lVar4);
      byteCodeToString_abi_cxx11_(&local_58,this,bc,false);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                                  local_58._M_dataplus._M_p._0_1_),
                          local_58._M_string_length);
      local_31 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_31,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
          &local_58.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                        local_58.field_2._M_allocated_capacity + 1);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < (ulong)((long)(fn->byteCode).
                                   super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(fn->byteCode).
                                   super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"| \\------------------\n",0x16);
  return;
}

Assistant:

void runtime::VirtualMachine::printFunction(const bytecode::Function* fn) {
  this->out << "| | Argument Count: " << fn->argumentCount << '\n';
  this->out << "| | Local Count: " << fn->localsCount << '\n';
  this->out << "| | Capture Contexts:\n";
  for (std::size_t i = 0; i < fn->closures.size(); i++) {
    this->out << "| |   |" << i << "| ClosureContext(scopeOffsets:" << fn->closures.at(i).scopeOffsets << ", LocalIndex: " << fn->closures.at(i).localIndex << ")" << '\n';
  }
  this->out << "| | Byte Code:\n";
  for (std::size_t i = 0; i < fn->byteCode.size(); i++) {
    this->out << "| |   |" << i << "| " << this->byteCodeToString(fn->byteCode.at(i), false) << '\n';
  }
  this->out << "| \\------------------\n";
}